

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# some_types.h
# Opt level: O0

void hiberlite::
     hibernate<hiberlite::AVisitor<hiberlite::KillChildren>,int,std::vector<int,std::allocator<int>>>
               (AVisitor<hiberlite::KillChildren> *ar,
               pair<int,_std::vector<int,_std::allocator<int>_>_> *m,uint param_3)

{
  sql_nvp<std::vector<int,_std::allocator<int>_>_> local_1f0;
  sql_nvp<int> local_1a8;
  allocator local_159;
  string local_158 [39];
  allocator local_131;
  string local_130 [32];
  undefined1 local_110 [8];
  sql_nvp<std::vector<int,_std::allocator<int>_>_> s;
  string local_c0 [55];
  allocator local_89;
  string local_88 [32];
  undefined1 local_68 [8];
  sql_nvp<int> f;
  uint param_2_local;
  pair<int,_std::vector<int,_std::allocator<int>_>_> *m_local;
  AVisitor<hiberlite::KillChildren> *ar_local;
  
  f._68_4_ = param_3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"first",&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"",(allocator *)&s.field_0x47);
  sql_nvp<int>::sql_nvp((sql_nvp<int> *)local_68,(string *)local_88,&m->first,(string *)local_c0);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&s.field_0x47);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,"second",&local_131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158,"",&local_159);
  sql_nvp<std::vector<int,_std::allocator<int>_>_>::sql_nvp
            ((sql_nvp<std::vector<int,_std::allocator<int>_>_> *)local_110,(string *)local_130,
             &m->second,(string *)local_158);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  sql_nvp<int>::sql_nvp(&local_1a8,(sql_nvp<int> *)local_68);
  AVisitor<hiberlite::KillChildren>::operator&(ar,&local_1a8);
  sql_nvp<int>::~sql_nvp(&local_1a8);
  sql_nvp<std::vector<int,_std::allocator<int>_>_>::sql_nvp
            (&local_1f0,(sql_nvp<std::vector<int,_std::allocator<int>_>_> *)local_110);
  AVisitor<hiberlite::KillChildren>::operator&(ar,&local_1f0);
  sql_nvp<std::vector<int,_std::allocator<int>_>_>::~sql_nvp(&local_1f0);
  sql_nvp<std::vector<int,_std::allocator<int>_>_>::~sql_nvp
            ((sql_nvp<std::vector<int,_std::allocator<int>_>_> *)local_110);
  sql_nvp<int>::~sql_nvp((sql_nvp<int> *)local_68);
  return;
}

Assistant:

void hibernate(A& ar, std::pair<First,Second>& m, const unsigned int)
{
	sql_nvp<First> f("first", m.first);
	sql_nvp<Second> s("second", m.second);
	ar & f;
	ar & s;
}